

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall ON_Font::SetFromPostScriptName(ON_Font *this,wchar_t *postscript_font_name)

{
  bool bVar1;
  wchar_t *postscript_name;
  ON_wString local_postscript_font_name;
  ON_wString local_20;
  
  bVar1 = ModificationPermitted
                    (this,"",
                     "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                     ,0x2538);
  if (bVar1) {
    ON_wString::ON_wString(&local_20,postscript_font_name);
    ON_wString::TrimLeftAndRight(&local_20,(wchar_t *)0x0);
    postscript_name = ON_wString::operator_cast_to_wchar_t_(&local_20);
    operator=(this,&Unset);
    if ((postscript_name == (wchar_t *)0x0) || (*postscript_name == L'\0')) {
      bVar1 = false;
    }
    else {
      bVar1 = SetFromFontDescription(this,(wchar_t *)0x0,postscript_name);
    }
    ON_wString::~ON_wString(&local_20);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Font::SetFromPostScriptName(
  const wchar_t* postscript_font_name
)
{
  if ( false == ON_FONT_MODIFICATION_PERMITTED)
    return false;

  // Save name in local memory before clearing this
  ON_wString local_postscript_font_name(postscript_font_name);
  local_postscript_font_name.TrimLeftAndRight();
  postscript_font_name = static_cast<const wchar_t*>(local_postscript_font_name);

  *this = ON_Font::Unset;

  if (nullptr == postscript_font_name || 0 == postscript_font_name[0])
    return false;

#if defined(ON_RUNTIME_WIN)
  // TODO: Get Windows IDWriteFont with matching post_script_name

#elif defined (ON_RUNTIME_APPLE_CORE_TEXT_AVAILABLE)
  // If the current computer has the same font, this will return the
  // highest fidelity match.
  // NOTE WELL: The NSFont API fails for some valid PostScript names.
  // For example, the some of the 14 or so faces Helvetica Neue 
  // are not round tripped using the NSFont by name creation and
  // are round tripped by using the CTFont API.
  bool bIsSubstituteFont = false;
  CTFontRef apple_font = ON_Font::AppleCTFont(postscript_font_name,0.0, bIsSubstituteFont);
  if (nullptr != apple_font)
  {
    return SetFromAppleCTFont(apple_font,true);
  }
#endif

  return SetFromFontDescription(nullptr, postscript_font_name);
}